

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoDecompress.c
# Opt level: O0

UINTN GetInfo(void *Source,UINT32 SourceSize,UINT32 *DestinationSize,UINT32 *ScratchSize)

{
  UINT32 CompressedSize;
  UINT32 *ScratchSize_local;
  UINT32 *DestinationSize_local;
  UINT32 SourceSize_local;
  void *Source_local;
  
  if ((((Source == (void *)0x0) || (DestinationSize == (UINT32 *)0x0)) ||
      (ScratchSize == (UINT32 *)0x0)) || (SourceSize < 8)) {
    Source_local = (void *)0x1;
  }
  else if ((SourceSize < *Source + 8U) || (*Source + 8U < 8)) {
    Source_local = (void *)0x1;
  }
  else {
    *ScratchSize = 0x3440;
    *DestinationSize = *(UINT32 *)((long)Source + 4);
    Source_local = (void *)0x0;
  }
  return (UINTN)Source_local;
}

Assistant:

EFI_STATUS
EFIAPI
GetInfo (
    IN  CONST VOID  *Source,
    IN  UINT32      SourceSize,
    OUT UINT32      *DestinationSize,
    OUT UINT32      *ScratchSize
    )
{
    UINT32  CompressedSize;

    if (Source == NULL || DestinationSize == NULL || ScratchSize == NULL || SourceSize < 8) {
        return EFI_INVALID_PARAMETER;
    }

    CompressedSize = *(UINT32 *)Source;
    if (SourceSize < (CompressedSize + 8) || (CompressedSize + 8) < 8) {
        return EFI_INVALID_PARAMETER;
    }

    *ScratchSize = sizeof(SCRATCH_DATA);
    *DestinationSize = *((UINT32 *)Source + 1);

    return EFI_SUCCESS;
}